

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

QString * __thiscall
VcprojGenerator::extraCompilerName
          (QString *__return_storage_ptr__,VcprojGenerator *this,ProString *extraCompiler,
          QStringList *inputs,QStringList *outputs)

{
  QMakeProject *this_00;
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  ProStringList *this_01;
  long in_FS_OFFSET;
  QStringBuilder<const_ProString_&,_const_char_(&)[6]> local_78;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  local_78.b = (char (*) [6])0x2b32c7;
  local_78.a = extraCompiler;
  ProString::ProString<ProString_const&,char_const(&)[6]>(&local_68,&local_78);
  this_01 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)&local_68);
  ProStringList::join(__return_storage_ptr__,this_01,(QChar)0x20);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((__return_storage_ptr__->d).size == 0) {
    ProString::toQString(&local_68.m_string,extraCompiler);
  }
  else {
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xb])(&local_68,this,__return_storage_ptr__,inputs,outputs,0);
  }
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_68.m_string.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_68.m_string.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_68.m_string.d.ptr._4_4_;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_68.m_string.d.size;
  local_68.m_string.d.d = (Data *)pQVar1;
  local_68.m_string.d.ptr = pcVar2;
  local_68.m_string.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::extraCompilerName(const ProString &extraCompiler,
                                             const QStringList &inputs,
                                             const QStringList &outputs)
{
    QString name = project->values(ProKey(extraCompiler + ".name")).join(' ');
    if (name.isEmpty())
        name = extraCompiler.toQString();
    else
        name = replaceExtraCompilerVariables(name, inputs, outputs, NoShell);
    return name;
}